

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

pair<trieste::NodeDef_*,_trieste::NodeDef_*> __thiscall
trieste::NodeDef::same_parent(NodeDef *this,NodeDef *q)

{
  int local_50;
  int local_4c;
  int i_1;
  int i;
  NodeDef *t_1;
  NodeDef *t;
  int d2;
  int d1;
  NodeDef *p;
  NodeDef *q_local;
  NodeDef *this_local;
  
  t._4_4_ = 0;
  t._0_4_ = 0;
  for (t_1 = this; _i_1 = q, t_1 != (NodeDef *)0x0; t_1 = t_1->parent_) {
    t._4_4_ = t._4_4_ + 1;
  }
  for (; _i_1 != (NodeDef *)0x0; _i_1 = _i_1->parent_) {
    t._0_4_ = (int)t + 1;
  }
  _d2 = this;
  for (local_4c = 0; local_4c < t._4_4_ - (int)t; local_4c = local_4c + 1) {
    _d2 = _d2->parent_;
  }
  p = q;
  for (local_50 = 0; local_50 < (int)t - t._4_4_; local_50 = local_50 + 1) {
    p = p->parent_;
  }
  for (; _d2->parent_ != p->parent_; _d2 = _d2->parent_) {
    p = p->parent_;
  }
  q_local = this;
  std::pair<trieste::NodeDef_*,_trieste::NodeDef_*>::
  pair<trieste::NodeDef_*&,_trieste::NodeDef_*&,_true>
            ((pair<trieste::NodeDef_*,_trieste::NodeDef_*> *)&this_local,(NodeDef **)&d2,&p);
  return _this_local;
}

Assistant:

std::pair<NodeDef*, NodeDef*> same_parent(NodeDef* q)
    {
      auto p = this;

      // Adjust p and q to point to the same depth in the AST.
      int d1 = 0, d2 = 0;

      for (auto t = p; t; t = t->parent_)
        ++d1;
      for (auto t = q; t; t = t->parent_)
        ++d2;

      for (int i = 0; i < (d1 - d2); ++i)
        p = p->parent_;
      for (int i = 0; i < (d2 - d1); ++i)
        q = q->parent_;

      // Find the common parent.
      while (p->parent_ != q->parent_)
      {
        p = p->parent_;
        q = q->parent_;
      }

      return {p, q};
    }